

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  secp256k1_ge *psVar5;
  secp256k1_ge *psVar6;
  char *pcVar7;
  byte bVar8;
  secp256k1_fe local_2d8;
  uint64_t local_2a8;
  uint64_t uStack_2a0;
  uint64_t local_298;
  uint64_t uStack_290;
  uint64_t local_288;
  uint64_t uStack_280;
  uint64_t local_278;
  uint64_t uStack_270;
  secp256k1_fe local_268;
  secp256k1_ge p;
  secp256k1_fe local_1d8;
  secp256k1_fe local_1a8;
  secp256k1_ge q;
  secp256k1_ge gg;
  secp256k1_gej g2;
  
  bVar8 = 0;
  secp256k1_ge_from_storage(&p,pre_g);
  iVar1 = secp256k1_ge_is_valid_var(&p);
  if (iVar1 == 0) {
    pcVar7 = "test condition failed: secp256k1_ge_is_valid_var(&p)";
    uVar3 = 0x1043;
LAB_001314d3:
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,uVar3,pcVar7);
    abort();
  }
  g2.infinity = p.infinity;
  g2.x.n[0] = p.x.n[0];
  g2.x.n[1] = p.x.n[1];
  g2.x.n[2] = p.x.n[2];
  g2.x.n[3] = p.x.n[3];
  g2.x.n[4] = p.x.n[4];
  g2.y.n[0] = p.y.n[0];
  g2.y.n[1] = p.y.n[1];
  g2.y.n[2] = p.y.n[2];
  g2.y.n[3] = p.y.n[3];
  g2.y.n[4] = p.y.n[4];
  g2.z.n[0] = 1;
  g2.z.n[1] = 0;
  g2.z.n[2] = 0;
  g2.z.n[3] = 0;
  g2.z.n[4] = 0;
  secp256k1_gej_double_var(&g2,&g2,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&gg,&g2);
  local_278 = gg.x.n[0];
  uStack_270 = gg.x.n[1];
  local_288 = gg.x.n[2];
  uStack_280 = gg.x.n[3];
  local_298 = gg.y.n[0];
  uStack_290 = gg.y.n[1];
  local_2a8 = gg.y.n[2];
  uStack_2a0 = gg.y.n[3];
  lVar4 = 0x40;
  do {
    if (lVar4 == 0x80000) {
      return;
    }
    local_268.n[0] = (local_278 - p.x.n[0]) + 0x3ffffbfffff0bc;
    local_268.n[1] = (uStack_270 - p.x.n[1]) + 0x3ffffffffffffc;
    local_268.n[2] = (local_288 - p.x.n[2]) + 0x3ffffffffffffc;
    local_268.n[3] = (uStack_280 - p.x.n[3]) + 0x3ffffffffffffc;
    local_268.n[4] = (gg.x.n[4] - p.x.n[4]) + 0x3fffffffffffc;
    secp256k1_fe_impl_normalize_weak(&local_268);
    local_1a8.n[0] = (local_298 - p.y.n[0]) + 0x3ffffbfffff0bc;
    local_1a8.n[1] = (uStack_290 - p.y.n[1]) + 0x3ffffffffffffc;
    local_1a8.n[2] = (local_2a8 - p.y.n[2]) + 0x3ffffffffffffc;
    local_1a8.n[3] = (uStack_2a0 - p.y.n[3]) + 0x3ffffffffffffc;
    local_1a8.n[4] = (gg.y.n[4] - p.y.n[4]) + 0x3fffffffffffc;
    secp256k1_fe_impl_normalize_weak(&local_1a8);
    iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_268);
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_1a8);
      if (iVar1 != 0) {
        pcVar7 = 
        "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy)"
        ;
        uVar3 = 0x104c;
        goto LAB_001314d3;
      }
    }
    secp256k1_ge_from_storage(&q,(secp256k1_ge_storage *)((long)(pre_g->x).n + lVar4));
    iVar1 = secp256k1_ge_is_valid_var(&q);
    if (iVar1 == 0) {
      pcVar7 = "test condition failed: secp256k1_ge_is_valid_var(&q)";
      uVar3 = 0x104f;
      goto LAB_001314d3;
    }
    local_1d8.n[0] = (local_278 - q.x.n[0]) + 0x3ffffbfffff0bc;
    local_1d8.n[1] = (uStack_270 - q.x.n[1]) + 0x3ffffffffffffc;
    local_1d8.n[2] = (local_288 - q.x.n[2]) + 0x3ffffffffffffc;
    local_1d8.n[3] = (uStack_280 - q.x.n[3]) + 0x3ffffffffffffc;
    local_1d8.n[4] = (gg.x.n[4] - q.x.n[4]) + 0x3fffffffffffc;
    local_2d8.n[0] = q.y.n[0] + local_298;
    local_2d8.n[1] = q.y.n[1] + uStack_290;
    local_2d8.n[2] = q.y.n[2] + local_2a8;
    local_2d8.n[3] = q.y.n[3] + uStack_2a0;
    local_2d8.n[4] = q.y.n[4] + gg.y.n[4];
    iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_1d8);
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_2d8);
      if (iVar1 != 0) {
        pcVar7 = 
        "test condition failed: !secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy)"
        ;
        uVar3 = 0x1054;
        goto LAB_001314d3;
      }
    }
    iVar1 = secp256k1_fe_equal(&local_268,&local_1d8);
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_equal(&local_1a8,&local_2d8);
      if (iVar1 != 0) {
        pcVar7 = 
        "test condition failed: !secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy)";
        uVar3 = 0x1057;
        goto LAB_001314d3;
      }
    }
    secp256k1_fe_impl_mul(&local_268,&local_268,&local_2d8);
    secp256k1_fe_impl_mul(&local_1a8,&local_1a8,&local_1d8);
    iVar1 = secp256k1_fe_equal(&local_268,&local_1a8);
    if (iVar1 == 0) {
      pcVar7 = "test condition failed: secp256k1_fe_equal(&dpx, &dpy)";
      uVar3 = 0x105c;
      goto LAB_001314d3;
    }
    psVar5 = &q;
    psVar6 = &p;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      (psVar6->x).n[0] = (psVar5->x).n[0];
      psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
      psVar6 = (secp256k1_ge *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
    }
    lVar4 = lVar4 + 0x40;
  } while( true );
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}